

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNode.cpp
# Opt level: O0

Token __thiscall slang::syntax::SyntaxNode::getFirstToken(SyntaxNode *this)

{
  bool bVar1;
  SyntaxNode *this_00;
  SyntaxNode *pSVar2;
  ConstTokenOrSyntax *in_RDI;
  Token TVar3;
  ConstTokenOrSyntax child;
  size_t i;
  size_t childCount;
  Token result;
  Token in_stack_ffffffffffffffb0;
  SyntaxNode *in_stack_ffffffffffffffc0;
  SyntaxNode *local_28;
  Token local_10;
  
  this_00 = (SyntaxNode *)getChildCount((SyntaxNode *)in_stack_ffffffffffffffb0.info);
  local_28 = (SyntaxNode *)0x0;
  do {
    if (this_00 <= local_28) {
      parsing::Token::Token(in_stack_ffffffffffffffb0._0_8_);
      return local_10;
    }
    getChild(in_stack_ffffffffffffffc0,(size_t)in_stack_ffffffffffffffb0.info);
    bVar1 = ConstTokenOrSyntax::isToken((ConstTokenOrSyntax *)0xc77d82);
    if (bVar1) {
      in_stack_ffffffffffffffb0 = ConstTokenOrSyntax::token(in_RDI);
      bVar1 = parsing::Token::operator_cast_to_bool((Token *)0xc77da6);
      if (bVar1) {
        TVar3 = ConstTokenOrSyntax::token(in_RDI);
        return TVar3;
      }
    }
    else {
      pSVar2 = ConstTokenOrSyntax::node((ConstTokenOrSyntax *)0xc77dce);
      if (pSVar2 != (SyntaxNode *)0x0) {
        ConstTokenOrSyntax::node((ConstTokenOrSyntax *)0xc77dde);
        local_10 = getFirstToken(this_00);
        bVar1 = parsing::Token::operator_cast_to_bool((Token *)0xc77dfa);
        if (bVar1) {
          return local_10;
        }
      }
    }
    local_28 = (SyntaxNode *)((long)&local_28->kind + 1);
  } while( true );
}

Assistant:

parsing::Token SyntaxNode::getFirstToken() const {
    size_t childCount = getChildCount();
    for (size_t i = 0; i < childCount; i++) {
        auto child = getChild(i);
        if (child.isToken()) {
            if (child.token())
                return child.token();
        }
        else if (child.node()) {
            auto result = child.node()->getFirstToken();
            if (result)
                return result;
        }
    }
    return Token();
}